

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

NamedStructurePatternMemberSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NamedStructurePatternMemberSyntax,slang::syntax::NamedStructurePatternMemberSyntax_const&>
          (BumpAllocator *this,NamedStructurePatternMemberSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  Info *pIVar4;
  PatternSyntax *pPVar5;
  undefined4 uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  NamedStructurePatternMemberSyntax *pNVar15;
  
  pNVar15 = (NamedStructurePatternMemberSyntax *)allocate(this,0x40,8);
  uVar6 = *(undefined4 *)&(args->super_StructurePatternMemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_StructurePatternMemberSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_StructurePatternMemberSyntax).super_SyntaxNode.previewNode;
  TVar7 = (args->name).kind;
  uVar8 = (args->name).field_0x2;
  NVar9.raw = (args->name).numFlags.raw;
  uVar10 = (args->name).rawLen;
  pIVar3 = (args->name).info;
  TVar11 = (args->colon).kind;
  uVar12 = (args->colon).field_0x2;
  NVar13.raw = (args->colon).numFlags.raw;
  uVar14 = (args->colon).rawLen;
  pIVar4 = (args->colon).info;
  pPVar5 = (args->pattern).ptr;
  (pNVar15->super_StructurePatternMemberSyntax).super_SyntaxNode.kind =
       (args->super_StructurePatternMemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pNVar15->super_StructurePatternMemberSyntax).super_SyntaxNode.field_0x4 = uVar6;
  (pNVar15->super_StructurePatternMemberSyntax).super_SyntaxNode.parent = pSVar1;
  (pNVar15->super_StructurePatternMemberSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pNVar15->name).kind = TVar7;
  (pNVar15->name).field_0x2 = uVar8;
  (pNVar15->name).numFlags = (NumericTokenFlags)NVar9.raw;
  (pNVar15->name).rawLen = uVar10;
  (pNVar15->name).info = pIVar3;
  (pNVar15->colon).kind = TVar11;
  (pNVar15->colon).field_0x2 = uVar12;
  (pNVar15->colon).numFlags = (NumericTokenFlags)NVar13.raw;
  (pNVar15->colon).rawLen = uVar14;
  (pNVar15->colon).info = pIVar4;
  (pNVar15->pattern).ptr = pPVar5;
  return pNVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }